

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodegenerator.cpp
# Opt level: O1

void stackjit::ByteCodeGenerator::generateAttributes(ostream *stream,AttributeContainer *attributes)

{
  _Hash_node_base *p_Var1;
  string *psVar2;
  ostream *poVar3;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *puVar4;
  bool bVar5;
  _Hash_node_base *p_Var6;
  
  for (p_Var1 = (attributes->_M_h)._M_before_begin._M_nxt; p_Var1 != (_Hash_node_base *)0x0;
      p_Var1 = p_Var1->_M_nxt) {
    std::__ostream_insert<char,std::char_traits<char>>(stream,"\t@",2);
    psVar2 = Loader::Attribute::name_abi_cxx11_((Attribute *)(p_Var1 + 5));
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (stream,(psVar2->_M_dataplus)._M_p,psVar2->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"(",1);
    puVar4 = Loader::Attribute::values_abi_cxx11_((Attribute *)(p_Var1 + 5));
    p_Var6 = (puVar4->_M_h)._M_before_begin._M_nxt;
    if (p_Var6 != (_Hash_node_base *)0x0) {
      bVar5 = true;
      do {
        if (bVar5) {
          bVar5 = false;
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>(stream," ",1);
        }
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           (stream,(char *)p_Var6[1]._M_nxt,(long)p_Var6[2]._M_nxt);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"=",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar3,(char *)p_Var6[5]._M_nxt,(long)p_Var6[6]._M_nxt);
        p_Var6 = p_Var6->_M_nxt;
      } while (p_Var6 != (_Hash_node_base *)0x0);
    }
    std::__ostream_insert<char,std::char_traits<char>>(stream,")",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + (char)stream);
    std::ostream::put((char)stream);
    std::ostream::flush();
  }
  return;
}

Assistant:

void ByteCodeGenerator::generateAttributes(std::ostream& stream,
											   const Loader::AttributeContainer& attributes) {
		for (auto& current : attributes) {
			auto& attribute = current.second;
			stream << "\t@" << attribute.name() << "(";

			bool isFirst = true;
			for (auto& keyValue : attribute.values()) {
				if (!isFirst) {
					stream << " ";
				} else {
					isFirst = false;
				}

				stream << keyValue.first << "=" << keyValue.second;
			}

			stream << ")" << std::endl;
		}
	}